

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
wave::File::Read(vector<float,_std::allocator<float>_> *__return_storage_ptr__,File *this,
                uint64_t frame_number,error_code *err)

{
  Error err_00;
  error_code eVar1;
  undefined4 uStack_4c;
  Error wave_error;
  error_code *err_local;
  uint64_t frame_number_local;
  File *this_local;
  vector<float,_std::allocator<float>_> *output;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  err_00 = Read(this,frame_number,__return_storage_ptr__);
  eVar1 = make_error_code(err_00);
  *(ulong *)err = CONCAT44(uStack_4c,eVar1._M_value);
  err->_M_cat = eVar1._M_cat;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> File::Read(uint64_t frame_number, std::error_code& err) {
  std::vector<float> output;
  auto wave_error = Read(frame_number, &output);
  err = make_error_code(wave_error);
  return output;
}